

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desc_sroa.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::DescriptorScalarReplacement::ReplaceAccessChain
          (DescriptorScalarReplacement *this,Instruction *var,Instruction *use)

{
  IRContext *pIVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  Constant *this_00;
  Operand *pOVar4;
  uint32_t i;
  initializer_list<unsigned_int> init_list;
  uint32_t local_ec;
  OperandList new_operands;
  Operand local_c8;
  string local_98;
  string local_78;
  SmallVector<unsigned_int,_2UL> local_58;
  
  uVar2 = Instruction::NumInOperands(use);
  pIVar1 = (this->super_Pass).context_;
  if (uVar2 < 2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"Variable cannot be replaced: invalid instruction",
               (allocator<char> *)&local_c8);
    IRContext::EmitErrorMessage(pIVar1,&local_78,use);
  }
  else {
    this_00 = descsroautil::GetAccessChainIndexAsConst(pIVar1,use);
    if (this_00 != (Constant *)0x0) {
      uVar2 = analysis::Constant::GetU32(this_00);
      uVar2 = GetReplacementVariable(this,var,uVar2);
      uVar3 = Instruction::NumInOperands(use);
      if (uVar3 == 2) {
        pIVar1 = (this->super_Pass).context_;
        uVar3 = Instruction::result_id(use);
        IRContext::ReplaceAllUsesWith(pIVar1,uVar3,uVar2);
        IRContext::KillInst((this->super_Pass).context_,use);
      }
      else {
        new_operands.
        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        new_operands.
        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        new_operands.
        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pOVar4 = Instruction::GetOperand(use,0);
        std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
        emplace_back<spvtools::opt::Operand&>
                  ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                   &new_operands,pOVar4);
        pOVar4 = Instruction::GetOperand(use,1);
        std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
        emplace_back<spvtools::opt::Operand&>
                  ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                   &new_operands,pOVar4);
        init_list._M_len = 1;
        init_list._M_array = &local_ec;
        local_ec = uVar2;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
        local_c8.type = SPV_OPERAND_TYPE_ID;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_c8.words,&local_58);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
        emplace_back<spvtools::opt::Operand>
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   &new_operands,&local_c8);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_c8.words);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
        for (uVar2 = 4;
            uVar2 < (uint)(((long)(use->operands_).
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(use->operands_).
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x30);
            uVar2 = uVar2 + 1) {
          pOVar4 = Instruction::GetOperand(use,uVar2);
          std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
          emplace_back<spvtools::opt::Operand&>
                    ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                     &new_operands,pOVar4);
        }
        Instruction::ReplaceOperands(use,&new_operands);
        IRContext::UpdateDefUse((this->super_Pass).context_,use);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  (&new_operands);
      }
      return true;
    }
    pIVar1 = (this->super_Pass).context_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"Variable cannot be replaced: invalid index",
               (allocator<char> *)&local_c8);
    IRContext::EmitErrorMessage(pIVar1,&local_98,use);
  }
  std::__cxx11::string::_M_dispose();
  return false;
}

Assistant:

bool DescriptorScalarReplacement::ReplaceAccessChain(Instruction* var,
                                                     Instruction* use) {
  if (use->NumInOperands() <= 1) {
    context()->EmitErrorMessage(
        "Variable cannot be replaced: invalid instruction", use);
    return false;
  }

  const analysis::Constant* const_index =
      descsroautil::GetAccessChainIndexAsConst(context(), use);
  if (const_index == nullptr) {
    context()->EmitErrorMessage("Variable cannot be replaced: invalid index",
                                use);
    return false;
  }

  uint32_t idx = const_index->GetU32();
  uint32_t replacement_var = GetReplacementVariable(var, idx);

  if (use->NumInOperands() == 2) {
    // We are not indexing into the replacement variable.  We can replaces the
    // access chain with the replacement variable itself.
    context()->ReplaceAllUsesWith(use->result_id(), replacement_var);
    context()->KillInst(use);
    return true;
  }

  // We need to build a new access chain with the replacement variable as the
  // base address.
  Instruction::OperandList new_operands;

  // Same result id and result type.
  new_operands.emplace_back(use->GetOperand(0));
  new_operands.emplace_back(use->GetOperand(1));

  // Use the replacement variable as the base address.
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {replacement_var}});

  // Drop the first index because it is consumed by the replacement, and copy
  // the rest.
  for (uint32_t i = 4; i < use->NumOperands(); i++) {
    new_operands.emplace_back(use->GetOperand(i));
  }

  use->ReplaceOperands(new_operands);
  context()->UpdateDefUse(use);
  return true;
}